

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O3

bool FIX::Message::isHeaderField(int field,DataDictionary *pD)

{
  bool bVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  bool bVar6;
  
  bVar1 = isHeaderField(field);
  bVar6 = true;
  if (!bVar1) {
    if (pD == (DataDictionary *)0x0) {
      bVar6 = false;
    }
    else {
      p_Var3 = (pD->m_headerFields)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var5 = &(pD->m_headerFields)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = &p_Var5->_M_header;
      p_Var4 = &p_Var5->_M_header;
      if (p_Var3 != (_Base_ptr)0x0) {
        do {
          if (field <= (int)p_Var3[1]._M_color) {
            p_Var2 = p_Var3;
          }
          p_Var3 = (&p_Var3->_M_left)[(int)p_Var3[1]._M_color < field];
        } while (p_Var3 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var2 != p_Var5) &&
           (p_Var4 = p_Var2, field < (int)p_Var2[1]._M_color)) {
          p_Var4 = &p_Var5->_M_header;
        }
      }
      bVar6 = (_Rb_tree_header *)p_Var4 != p_Var5;
    }
  }
  return bVar6;
}

Assistant:

bool Message::isHeaderField(int field, const DataDictionary *pD) {
  if (isHeaderField(field)) {
    return true;
  }
  if (pD) {
    return pD->isHeaderField(field);
  }
  return false;
}